

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfasttext.cc
# Opt level: O2

fasttext_predictions_t *
cft_fasttext_predict(fasttext_t *handle,char *text,int32_t k,float threshold,char **errptr)

{
  pointer ppVar1;
  size_t sVar2;
  fasttext_predictions_t *pfVar3;
  fasttext_prediction_t *pfVar4;
  char *pcVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  char **ppcVar7;
  bool bVar8;
  allocator local_1fd;
  float local_1fc;
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  predictions;
  string local_1d8 [32];
  stringstream ioss;
  
  predictions.
  super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  predictions.
  super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  predictions.
  super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1fc = threshold;
  std::__cxx11::string::string(local_1d8,text,&local_1fd);
  std::__cxx11::stringstream::stringstream((stringstream *)&ioss,local_1d8,_S_out|_S_in);
  std::__cxx11::string::~string(local_1d8);
  fasttext::FastText::predictLine((FastText *)handle,(istream *)&ioss,&predictions,k,local_1fc);
  ppVar1 = predictions.
           super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  sVar2 = ((long)predictions.
                 super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)predictions.
                super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x28;
  pfVar3 = (fasttext_predictions_t *)malloc(0x10);
  pfVar3->length = sVar2;
  pfVar4 = (fasttext_prediction_t *)malloc(sVar2 << 4);
  ppcVar7 = &pfVar4->label;
  while (pbVar6 = &ppVar1->second, bVar8 = sVar2 != 0, sVar2 = sVar2 - 1, bVar8) {
    pcVar5 = strdup((pbVar6->_M_dataplus)._M_p);
    *ppcVar7 = pcVar5;
    ((fasttext_prediction_t *)(ppcVar7 + -1))->prob = *(float *)((long)(pbVar6 + -1) + 0x18);
    ppVar1 = (pointer)(pbVar6 + 1);
    ppcVar7 = ppcVar7 + 2;
  }
  pfVar3->predictions = pfVar4;
  std::__cxx11::stringstream::~stringstream((stringstream *)&ioss);
  std::
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&predictions);
  return pfVar3;
}

Assistant:

fasttext_predictions_t* cft_fasttext_predict(fasttext_t* handle, const char* text, int32_t k, float threshold, char** errptr) {
    std::vector<std::pair<fasttext::real, std::string>> predictions;
    std::stringstream ioss(text);
    try {
        ((FastText*)handle)->predictLine(ioss, predictions, k, threshold);
    } catch (const std::invalid_argument& e) {
        save_error(errptr, e);
        return nullptr;
    }
    size_t len = predictions.size();
    fasttext_predictions_t* ret = static_cast<fasttext_predictions_t*>(malloc(sizeof(fasttext_predictions_t)));
    ret->length = len;
    fasttext_prediction_t* c_preds = static_cast<fasttext_prediction_t*>(malloc(sizeof(fasttext_prediction_t) * len));
    for (size_t i = 0; i < len; i++) {
        c_preds[i].label = strdup(predictions[i].second.c_str());
        c_preds[i].prob = predictions[i].first;
    }
    ret->predictions = c_preds;
    return ret;
}